

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AttributeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Scope *args_2,LookupLocation *args_3,ExpressionSyntax *args_4)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  Scope *pSVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  AttributeSymbol *pAVar7;
  
  pAVar7 = (AttributeSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeSymbol *)this->endPtr < pAVar7 + 1) {
    pAVar7 = (AttributeSymbol *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pAVar7 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  pSVar4 = args_3->scope;
  uVar5 = args_3->index;
  uVar6 = *(undefined4 *)&args_3->field_0xc;
  (pAVar7->super_Symbol).kind = Attribute;
  (pAVar7->super_Symbol).name._M_len = sVar2;
  (pAVar7->super_Symbol).name._M_str = pcVar3;
  (pAVar7->super_Symbol).location = SVar1;
  (pAVar7->super_Symbol).parentScope = (Scope *)0x0;
  (pAVar7->super_Symbol).nextInScope = (Symbol *)0x0;
  (pAVar7->super_Symbol).indexInScope = 0;
  (pAVar7->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pAVar7->symbol = (Symbol *)0x0;
  pAVar7->scope = args_2;
  pAVar7->expr = args_4;
  pAVar7->value = (ConstantValue *)0x0;
  (pAVar7->lookupLocation).scope = pSVar4;
  (pAVar7->lookupLocation).index = uVar5;
  *(undefined4 *)&(pAVar7->lookupLocation).field_0xc = uVar6;
  return pAVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }